

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redirect_path.c
# Opt level: O0

void apprun_load_path_mappings(void)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  apprun_path_mapping *paVar4;
  char *pcVar5;
  apprun_path_mapping *mapping;
  char *semicolon_pos;
  char *colon_pos;
  char *pcStack_20;
  int i_1;
  char *str_itr;
  int i;
  char *path_mappings_env;
  
  pcStack_20 = getenv("APPDIR_PATH_MAPPINGS");
  if ((pcStack_20 != (char *)0x0) && (apprun_path_mappings == (apprun_path_mapping **)0x0)) {
    for (str_itr._4_4_ = 0; sVar1 = strlen(pcStack_20), (ulong)(long)str_itr._4_4_ < sVar1;
        str_itr._4_4_ = str_itr._4_4_ + 1) {
      if (pcStack_20[str_itr._4_4_] == ';') {
        apprun_path_mappings_size = apprun_path_mappings_size + 1;
      }
    }
    apprun_path_mappings = (apprun_path_mapping **)malloc((long)apprun_path_mappings_size << 3);
    for (colon_pos._4_4_ = 0; colon_pos._4_4_ < apprun_path_mappings_size;
        colon_pos._4_4_ = colon_pos._4_4_ + 1) {
      pcVar2 = strchr(pcStack_20,0x3a);
      pcVar3 = strchr(pcStack_20,0x3b);
      if ((pcVar2 != (char *)0x0) && (pcVar3 != (char *)0x0)) {
        paVar4 = (apprun_path_mapping *)malloc(0x10);
        pcVar5 = strndup(pcStack_20,(long)pcVar2 - (long)pcStack_20);
        paVar4->path = pcVar5;
        pcVar2 = strndup(pcVar2 + 1,(size_t)(pcVar3 + (-1 - (long)pcVar2)));
        paVar4->mapping = pcVar2;
        apprun_path_mappings[colon_pos._4_4_] = paVar4;
      }
      pcStack_20 = pcVar3 + 1;
    }
  }
  return;
}

Assistant:

void apprun_load_path_mappings() {
    char *path_mappings_env = getenv(APPDIR_PATH_MAPPINGS_ENV);
    if (path_mappings_env == NULL || apprun_path_mappings != NULL) {
        return;
    }

    for (int i = 0; i < strlen(path_mappings_env); i++) {
        if (path_mappings_env[i] == ';')
            apprun_path_mappings_size++;
    }

    apprun_path_mappings = malloc(sizeof(apprun_path_mapping *) * apprun_path_mappings_size);

    char *str_itr = path_mappings_env;
    for (int i = 0; i < apprun_path_mappings_size; i++) {

        char *colon_pos, *semicolon_pos;

        colon_pos = strchr(str_itr, ':');
        semicolon_pos = strchr(str_itr, ';');
        if (colon_pos && semicolon_pos) {
            apprun_path_mapping *mapping;
            mapping = malloc(sizeof(apprun_path_mapping));
            mapping->path = strndup(str_itr, colon_pos - str_itr);
            mapping->mapping = strndup(colon_pos + 1, semicolon_pos - colon_pos - 1);
            apprun_path_mappings[i] = mapping;
        }

        str_itr = semicolon_pos + 1;
    }
}